

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O2

ktx_error_code_e ktxTexture2_WriteToNamedFile(ktxTexture2 *This,char *dstname)

{
  ktx_error_code_e kVar1;
  FILE *__stream;
  
  if (This == (ktxTexture2 *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    __stream = fopen(dstname,"wb");
    if (__stream == (FILE *)0x0) {
      kVar1 = KTX_FILE_OPEN_FAILED;
    }
    else {
      kVar1 = ktxTexture2_WriteToStdioStream(This,(FILE *)__stream);
      fclose(__stream);
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_WriteToNamedFile(ktxTexture2* This, const char* const dstname)
{
    KTX_error_code result;
    FILE* dst;

    if (!This)
        return KTX_INVALID_VALUE;

    dst = ktxFOpenUTF8(dstname, "wb");
    if (dst) {
        result = ktxTexture2_WriteToStdioStream(This, dst);
        fclose(dst);
    } else
        result = KTX_FILE_OPEN_FAILED;

    return result;
}